

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_render_pass_attachments
          (Impl *this,Value *attachments,VkAttachmentDescription **out_attachments)

{
  SizeType SVar1;
  VkAttachmentDescription *pVVar2;
  ConstValueIterator pGVar3;
  Value *local_38;
  ConstValueIterator itr;
  VkAttachmentDescription *ret;
  VkAttachmentDescription *infos;
  VkAttachmentDescription **out_attachments_local;
  Value *attachments_local;
  Impl *this_local;
  
  SVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(attachments);
  pVVar2 = ScratchAllocator::allocate_n_cleared<VkAttachmentDescription>
                     (&this->allocator,(ulong)SVar1);
  local_38 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::Begin(attachments);
  ret = pVVar2;
  while( true ) {
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End(attachments);
    if (local_38 == pGVar3) break;
    parse_render_pass_attachments_base<VkAttachmentDescription>(ret,local_38);
    local_38 = local_38 + 1;
    ret = ret + 1;
  }
  *out_attachments = pVVar2;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_render_pass_attachments(const Value &attachments, const VkAttachmentDescription **out_attachments)
{
	auto *infos = allocator.allocate_n_cleared<VkAttachmentDescription>(attachments.Size());
	auto *ret = infos;

	for (auto itr = attachments.Begin(); itr != attachments.End(); ++itr, infos++)
		parse_render_pass_attachments_base(*infos, *itr);

	*out_attachments = ret;
	return true;
}